

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json_schema.c
# Opt level: O1

void jsons_print_typedef(lyout *out,lys_tpdf *tpdf,int *first)

{
  char *pcVar1;
  int local_2c [2];
  int f;
  
  if (first == (int *)0x0) {
    pcVar1 = ",";
  }
  else {
    pcVar1 = "";
    if (*first == 0) {
      pcVar1 = ",";
    }
  }
  ly_print(out,"%s\"%s\":{",pcVar1,tpdf->name);
  local_2c[0] = 1;
  jsons_print_type_(out,&tpdf->type,1,local_2c);
  jsons_print_text(out,"description","text",tpdf->dsc,1,(int *)0x0);
  jsons_print_text(out,"reference","text",tpdf->ref,1,(int *)0x0);
  jsons_print_status(out,tpdf->flags,(int *)0x0);
  if (tpdf->units != (char *)0x0) {
    ly_print(out,"%s\"%s\":{\"%s\":\"%s\"%s",",","units","name",tpdf->units,"}");
  }
  if (tpdf->dflt != (char *)0x0) {
    ly_print(out,"%s\"%s\":{\"%s\":\"%s\"%s",",","default","value",tpdf->dflt,"}");
  }
  ly_print(out,"}");
  if (first != (int *)0x0) {
    *first = 0;
  }
  return;
}

Assistant:

static void
jsons_print_typedef(struct lyout *out, const struct lys_tpdf *tpdf, int *first)
{
    int f;

    ly_print(out, "%s\"%s\":{", (first && (*first)) ? "" : ",", tpdf->name);
    f = 1;
    jsons_print_type(out, &tpdf->type, &f);
    jsons_print_text(out, "description", "text", tpdf->dsc, 1, NULL);
    jsons_print_text(out, "reference", "text", tpdf->ref, 1, NULL);
    jsons_print_status(out, tpdf->flags, NULL);
    jsons_print_object(out, "units", "name", tpdf->units, 1, NULL);
    jsons_print_object(out, "default", "value", tpdf->dflt, 1, NULL);
    ly_print(out, "}");

    if (first) {
        (*first) = 0;
    }
}